

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool BaseFile_Resize(TFileStream *pStream,ULONGLONG NewFileSize)

{
  int iVar1;
  DWORD *pDVar2;
  ULONGLONG NewFileSize_local;
  TFileStream *pStream_local;
  
  iVar1 = ftruncate64((int)*(undefined8 *)((long)&pStream->Base + 0x18),NewFileSize);
  if (iVar1 != -1) {
    (pStream->Base).File.FileSize = NewFileSize;
  }
  else {
    pDVar2 = (DWORD *)__errno_location();
    SetLastError(*pDVar2);
  }
  return iVar1 != -1;
}

Assistant:

static bool BaseFile_Resize(TFileStream * pStream, ULONGLONG NewFileSize)
{
#ifdef PLATFORM_WINDOWS
    {
        LONG FileSizeHi = (LONG)(NewFileSize >> 32);
        LONG FileSizeLo;
        DWORD dwNewPos;
        bool bResult;

        // Set the position at the new file size
        dwNewPos = SetFilePointer(pStream->Base.File.hFile, (LONG)NewFileSize, &FileSizeHi, FILE_BEGIN);
        if(dwNewPos == INVALID_SET_FILE_POINTER && GetLastError() != ERROR_SUCCESS)
            return false;

        // Set the current file pointer as the end of the file
        bResult = (bool)SetEndOfFile(pStream->Base.File.hFile);
        if(bResult)
            pStream->Base.File.FileSize = NewFileSize;

        // Restore the file position
        FileSizeHi = (LONG)(pStream->Base.File.FilePos >> 32);
        FileSizeLo = (LONG)(pStream->Base.File.FilePos);
        SetFilePointer(pStream->Base.File.hFile, FileSizeLo, &FileSizeHi, FILE_BEGIN);
        return bResult;
    }
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    {
        if(ftruncate64((intptr_t)pStream->Base.File.hFile, (off64_t)NewFileSize) == -1)
        {
            SetLastError(errno);
            return false;
        }

        pStream->Base.File.FileSize = NewFileSize;
        return true;
    }
#endif
}